

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O1

bool __thiscall ON_StringBuffer::GrowBuffer(ON_StringBuffer *this,size_t buffer_capacity)

{
  char *pcVar1;
  bool bVar2;
  
  if ((this->m_buffer_capacity < buffer_capacity) ||
     ((bVar2 = true, this->m_buffer_capacity != 0 && (this->m_buffer == (char *)0x0)))) {
    pcVar1 = this->m_heap_buffer;
    if (pcVar1 == (char *)0x0 || this->m_heap_buffer_capacity < buffer_capacity) {
      if (pcVar1 != (char *)0x0) {
        operator_delete__(pcVar1);
      }
      pcVar1 = (char *)operator_new__(buffer_capacity,(nothrow_t *)&std::nothrow);
      this->m_heap_buffer = pcVar1;
      if (pcVar1 != (char *)0x0) {
        pcVar1 = (char *)buffer_capacity;
      }
      this->m_heap_buffer_capacity = (size_t)pcVar1;
    }
    this->m_buffer = this->m_heap_buffer;
    this->m_buffer_capacity = this->m_heap_buffer_capacity;
    bVar2 = buffer_capacity <= this->m_heap_buffer_capacity;
  }
  return bVar2;
}

Assistant:

bool ON_StringBuffer::GrowBuffer(
  size_t buffer_capacity
  )
{
  if (buffer_capacity <= m_buffer_capacity && (nullptr != m_buffer || 0 == m_buffer_capacity))
    return true;

  if (buffer_capacity > m_heap_buffer_capacity || nullptr == m_heap_buffer)
  {
    if (nullptr != m_heap_buffer)
      delete[] m_heap_buffer;
    m_heap_buffer = new(std::nothrow) char[buffer_capacity];
    m_heap_buffer_capacity = (nullptr != m_heap_buffer) ? buffer_capacity : 0;
  }

  m_buffer = m_heap_buffer;
  m_buffer_capacity = m_heap_buffer_capacity;

  return (buffer_capacity <= m_buffer_capacity);
}